

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O2

void check_lcp_and_cache<unsigned_char>
               (uchar *latest,uchar *from0,lcp_t lcp0,uchar cache0,uchar *from1,lcp_t lcp1,
               uchar cache1)

{
  uchar uVar1;
  lcp_t lVar2;
  
  lVar2 = lcp(latest,from0);
  if (lVar2 != lcp0) {
    __assert_fail("lcp(latest, from0) == lcp0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x41b,
                  "void check_lcp_and_cache(unsigned char *, unsigned char *, lcp_t, CharT, unsigned char *, lcp_t, CharT) [CharT = unsigned char]"
                 );
  }
  lVar2 = lcp(latest,from1);
  if (lVar2 != lcp1) {
    __assert_fail("lcp(latest, from1) == lcp1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x41c,
                  "void check_lcp_and_cache(unsigned char *, unsigned char *, lcp_t, CharT, unsigned char *, lcp_t, CharT) [CharT = unsigned char]"
                 );
  }
  uVar1 = get_char<unsigned_char>(from0,lcp0);
  if (uVar1 != cache0) {
    __assert_fail("get_char<CharT>(from0, lcp0) == cache0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x41d,
                  "void check_lcp_and_cache(unsigned char *, unsigned char *, lcp_t, CharT, unsigned char *, lcp_t, CharT) [CharT = unsigned char]"
                 );
  }
  uVar1 = get_char<unsigned_char>(from1,lcp1);
  if (uVar1 == cache1) {
    return;
  }
  __assert_fail("get_char<CharT>(from1, lcp1) == cache1",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                ,0x41e,
                "void check_lcp_and_cache(unsigned char *, unsigned char *, lcp_t, CharT, unsigned char *, lcp_t, CharT) [CharT = unsigned char]"
               );
}

Assistant:

static void
check_lcp_and_cache(unsigned char* latest,
                    unsigned char* from0, lcp_t lcp0, CharT cache0,
                    unsigned char* from1, lcp_t lcp1, CharT cache1)
{
	(void) latest;
	(void) from0; (void) lcp0; (void) cache0;
	(void) from1; (void) lcp1; (void) cache1;
	/*debug()<<"******** CHECK ********\n"
	       <<"Latest: '"<<latest<<"'\n"
	       <<"     0: '"<<from0<<"', lcp="<<lcp0<<", cache="<<to_str(cache0)<<"\n"
	       <<"     1: '"<<from1<<"', lcp="<<lcp1<<", cache="<<to_str(cache1)<<"\n"
	       <<"***********************\n";*/
	assert(lcp(latest, from0) == lcp0);
	assert(lcp(latest, from1) == lcp1);
	assert(get_char<CharT>(from0, lcp0) == cache0);
	assert(get_char<CharT>(from1, lcp1) == cache1);
}